

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troff_display_driver.cpp
# Opt level: O0

void __thiscall TroffDisplayDriver::display(TroffDisplayDriver *this,Document *doc,ostream *output)

{
  size_t sVar1;
  Paragraph *pPVar2;
  undefined4 uVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  long local_110;
  UrlLineElement *local_100;
  CodeLineElement *local_f0;
  ItalicLineElement *local_e0;
  string local_b8 [48];
  string local_88 [32];
  ulong local_68;
  size_t j;
  size_t i;
  bool is_ulist;
  bool is_quotation;
  long lStack_50;
  bool is_verbatim;
  UrlLineElement *url_le;
  CodeLineElement *code_le;
  ItalicLineElement *italic_le;
  BoldLineElement *bold_le;
  LineElement *l;
  Paragraph *p;
  ostream *output_local;
  Document *doc_local;
  TroffDisplayDriver *this_local;
  
  l = (LineElement *)0x0;
  bold_le = (BoldLineElement *)0x0;
  italic_le = (ItalicLineElement *)0x0;
  code_le = (CodeLineElement *)0x0;
  url_le = (UrlLineElement *)0x0;
  lStack_50 = 0;
  i._7_1_ = 0;
  i._6_1_ = 0;
  i._5_1_ = 0;
  j = 0;
  p = (Paragraph *)output;
  output_local = (ostream *)doc;
  doc_local = (Document *)this;
  do {
    sVar1 = j;
    uVar4 = Document::size();
    if (uVar4 <= sVar1) {
      return;
    }
    l = (LineElement *)Document::operator[]((ulong)output_local);
    uVar3 = (**(code **)(*(long *)l + 8))();
    switch(uVar3) {
    case 1:
      std::operator<<((ostream *)p,".TH ");
      break;
    case 2:
      std::operator<<((ostream *)p,".SH ");
      break;
    case 3:
      std::operator<<((ostream *)p,".SS ");
      break;
    case 8:
      poVar5 = std::operator<<((ostream *)p,".TP");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,".BR ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case 10:
    case 0xb:
    default:
      poVar5 = std::operator<<((ostream *)p,".PP");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    for (local_68 = 0; uVar4 = local_68, uVar6 = Paragraph::size(), uVar4 < uVar6;
        local_68 = local_68 + 1) {
      bold_le = (BoldLineElement *)Paragraph::operator[]((ulong)l);
      if (bold_le == (BoldLineElement *)0x0) {
        local_e0 = (ItalicLineElement *)0x0;
      }
      else {
        local_e0 = (ItalicLineElement *)
                   __dynamic_cast(bold_le,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
      }
      italic_le = local_e0;
      if (bold_le == (BoldLineElement *)0x0) {
        local_f0 = (CodeLineElement *)0x0;
      }
      else {
        local_f0 = (CodeLineElement *)
                   __dynamic_cast(bold_le,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
      }
      code_le = local_f0;
      if (bold_le == (BoldLineElement *)0x0) {
        local_100 = (UrlLineElement *)0x0;
      }
      else {
        local_100 = (UrlLineElement *)
                    __dynamic_cast(bold_le,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
      }
      url_le = local_100;
      if (bold_le == (BoldLineElement *)0x0) {
        local_110 = 0;
      }
      else {
        local_110 = __dynamic_cast(bold_le,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
      }
      lStack_50 = local_110;
      if (code_le == (CodeLineElement *)0x0) {
        if (italic_le == (ItalicLineElement *)0x0) {
          if (url_le != (UrlLineElement *)0x0) {
            (**(code **)(*(long *)l + 8))();
          }
        }
        else {
          std::operator<<((ostream *)p,"\\fB");
        }
      }
      else {
        std::operator<<((ostream *)p,"\\fI");
      }
      pPVar2 = p;
      if (lStack_50 == 0) {
        (**(code **)(*(long *)bold_le + 0x10))();
        std::operator<<((ostream *)pPVar2,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else {
        poVar5 = (ostream *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,".IR ");
        UrlLineElement::url_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_88);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_88);
      }
      if ((code_le == (CodeLineElement *)0x0) && (italic_le == (ItalicLineElement *)0x0)) {
        if (url_le != (UrlLineElement *)0x0) {
          (**(code **)(*(long *)l + 8))();
        }
      }
      else {
        std::operator<<((ostream *)p,"\\fR");
      }
    }
    uVar3 = (**(code **)(*(long *)l + 8))();
    switch(uVar3) {
    case 1:
    case 2:
    case 8:
    default:
      std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      break;
    case 10:
      break;
    case 0xb:
    }
    j = j + 1;
  } while( true );
}

Assistant:

void TroffDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		is_quotation(false),
		is_ulist(false);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << ".TH ";
				break;
			case Paragraph::Level::Title2:
				output << ".SH ";
				break;
			case Paragraph::Level::Title3:
				output << ".SS ";
				break;
			case Paragraph::Level::UList1:
				output << ".TP" << endl << ".BR " << endl;
				break;
			case Paragraph::Level::Code:
			case Paragraph::Level::Quote:
			default:
				output << ".PP" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "\\fI";
			} else if (bold_le) {
				output << "\\fB";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
			
			if (url_le) {
				output << endl << ".IR " << url_le->url() << endl;
			} else {
				output << l->content();
			}

			if (italic_le or bold_le) {
				output << "\\fR";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				break;
			case Paragraph::Level::Quote:
				break;
			case Paragraph::Level::UList1:
			case Paragraph::Level::Title1:
			case Paragraph::Level::Title2:
			default:
				output << endl;
				break;
		}
	}
}